

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O2

shared_ptr<embree::Texture> __thiscall embree::Texture::load(Texture *this,FileName *fileName)

{
  iterator iVar1;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Texture *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<embree::Texture> sVar4;
  Ref<embree::Image> local_80;
  key_type local_78;
  shared_ptr<embree::Texture> tex;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_78,(string *)fileName);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                  *)texture_cache_abi_cxx11_,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  if (iVar1._M_node == (_Base_ptr)(texture_cache_abi_cxx11_ + 8)) {
    this_00 = (Texture *)operator_new(0x40);
    loadImage((embree *)&local_80,fileName,false);
    std::__cxx11::string::string((string *)&local_48,(string *)fileName);
    Texture(this_00,&local_80,&local_48);
    std::__shared_ptr<embree::Texture,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<embree::Texture,void>
              ((__shared_ptr<embree::Texture,(__gnu_cxx::_Lock_policy)2> *)&tex,this_00);
    std::__cxx11::string::~string((string *)&local_48);
    if (local_80.ptr != (Image *)0x0) {
      (*((local_80.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    std::__cxx11::string::string((string *)&local_78,(string *)fileName);
    p_Var2 = &std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                            *)texture_cache_abi_cxx11_,&local_78)->
              super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
              (p_Var2,&tex.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var2);
    std::__cxx11::string::~string((string *)&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&tex.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    _Var3._M_pi = extraout_RDX_00;
  }
  else {
    std::__cxx11::string::string((string *)&local_78,(string *)fileName);
    p_Var2 = &std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                            *)texture_cache_abi_cxx11_,&local_78)->
              super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var2);
    std::__cxx11::string::~string((string *)&local_78);
    _Var3._M_pi = extraout_RDX;
  }
  sVar4.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<embree::Texture>)
         sVar4.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Texture> Texture::load(const FileName& fileName)
  {
    if (texture_cache.find(fileName.str()) != texture_cache.end())
      return texture_cache[fileName.str()];

    std::shared_ptr<Texture> tex(new Texture(loadImage(fileName),fileName));
    return texture_cache[fileName.str()] = tex;
  }